

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_at_most_n.hpp
# Opt level: O0

tuple<std::_List_const_iterator<int>,_long,_int_*> * __thiscall
burst::detail::copy_at_most_n_impl<std::_List_const_iterator<int>,long,int*>
          (tuple<std::_List_const_iterator<int>,_long,_int_*> *__return_storage_ptr__,detail *this,
          _List_node_base *first,int *last,long n)

{
  bool bVar1;
  reference piVar2;
  long local_48;
  int *local_40;
  long m;
  int *result_local;
  long n_local;
  _Self local_20;
  _List_const_iterator<int> last_local;
  _List_const_iterator<int> first_local;
  
  local_40 = last;
  m = n;
  result_local = last;
  local_20._M_node = first;
  last_local._M_node = (_List_node_base *)this;
  while (bVar1 = std::operator!=(&last_local,&local_20), bVar1 && 0 < (long)local_40) {
    piVar2 = std::_List_const_iterator<int>::operator*(&last_local);
    *(int *)m = *piVar2;
    std::_List_const_iterator<int>::operator++(&last_local);
    m = m + 4;
    local_40 = (int *)((long)local_40 + -1);
  }
  local_48 = (long)result_local - (long)local_40;
  std::make_tuple<std::_List_const_iterator<int>&,long,int*&>
            (__return_storage_ptr__,&last_local,&local_48,(int **)&m);
  return __return_storage_ptr__;
}

Assistant:

std::tuple<InputIterator, Integral, OutputIterator>
            copy_at_most_n_impl
            (
                InputIterator first,
                InputIterator last,
                Integral n,
                OutputIterator result,
                std::input_iterator_tag
            )
        {
            auto m = n;
            while (first != last && m > 0)
            {
                *result = *first;

                ++first;
                ++result;
                --m;
            }

            return std::make_tuple(first, n - m, result);
        }